

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void curve_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                  t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_float tVar4;
  int yloc;
  int xloc;
  int y2;
  int y1;
  int x2;
  int x1;
  _fielddesc *f;
  int n;
  int i;
  t_curve *x;
  int *yp1_local;
  int *xp1_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  iVar1 = *(int *)&z[0xd].g_next;
  y1 = 0x7fffffff;
  y2 = -0x7fffffff;
  xloc = 0x7fffffff;
  yloc = -0x7fffffff;
  tVar4 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
  if ((((tVar4 == 0.0) && (!NAN(tVar4))) ||
      (((*(ushort *)&glist->field_0xe8 >> 5 & 1) != 0 && (((ulong)z[3].g_pd & 8) != 0)))) ||
     (((*(ushort *)&glist->field_0xe8 >> 5 & 1) == 0 && (((ulong)z[3].g_pd & 4) != 0)))) {
    *yp1 = 0x7fffffff;
    *xp1 = 0x7fffffff;
    *yp2 = -0x7fffffff;
    *xp2 = -0x7fffffff;
  }
  else {
    f._4_4_ = 0;
    _x2 = z[0xe].g_pd;
    for (; f._4_4_ < iVar1; f._4_4_ = f._4_4_ + 1) {
      tVar4 = fielddesc_getcoord((_fielddesc *)_x2,template,data,0);
      tVar4 = glist_xtopixels(glist,basex + tVar4);
      iVar2 = (int)tVar4;
      tVar4 = fielddesc_getcoord((_fielddesc *)&_x2->c_nmethod,template,data,0);
      tVar4 = glist_ytopixels(glist,basey + tVar4);
      iVar3 = (int)tVar4;
      if (iVar2 < y1) {
        y1 = iVar2;
      }
      if (y2 < iVar2) {
        y2 = iVar2;
      }
      if (iVar3 < xloc) {
        xloc = iVar3;
      }
      if (yloc < iVar3) {
        yloc = iVar3;
      }
      _x2 = (t_pd)&_x2->c_symbolmethod;
    }
    *xp1 = y1;
    *yp1 = xloc;
    *xp2 = y2;
    *yp2 = yloc;
  }
  return;
}

Assistant:

static void curve_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    if (!fielddesc_getfloat(&x->x_vis, template, data, 0) ||
        (glist->gl_edit && x->x_flags & NOMOUSEEDIT) ||
        (!glist->gl_edit && x->x_flags & NOMOUSERUN))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(f, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(f+1, template, data, 0));
        if (xloc < x1) x1 = xloc;
        if (xloc > x2) x2 = xloc;
        if (yloc < y1) y1 = yloc;
        if (yloc > y2) y2 = yloc;
    }
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}